

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplePreprocessor.hpp
# Opt level: O1

bool __thiscall
OpenMD::SimplePreprocessor::doPreprocess
          (SimplePreprocessor *this,istream *myStream,string *filename,int startingLine,ostream *os,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *defineSet,stack<bool,_std::deque<bool,_std::allocator<bool>_>_> *ifStates)

{
  pointer pcVar1;
  char cVar2;
  int iVar3;
  ostream *poVar4;
  long *plVar5;
  size_t sVar6;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var7;
  iterator iVar8;
  _Elt_pointer pbVar9;
  OpenMDException *this_00;
  long lVar10;
  int iVar11;
  ulong uVar12;
  char *pcVar13;
  bool bVar14;
  bool bVar15;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pVar16;
  SimplePreprocessor subPreprocessor;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  string line;
  string includeFilename;
  StringTokenizer tokenizer;
  ifstream includeStream;
  stringstream ss;
  char buffer [8192];
  SimplePreprocessor local_24d9;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_24d8;
  long *local_24d0;
  ulong local_24c8;
  undefined1 local_24c0;
  undefined7 uStack_24bf;
  undefined8 uStack_24b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_24b0;
  long *local_2498;
  ulong local_2490;
  long local_2488;
  undefined8 uStack_2480;
  string local_2478;
  long *local_2458;
  _Base_ptr local_2450;
  string *local_2448;
  StringTokenizer local_2440;
  string local_23e8;
  undefined1 local_23c8 [520];
  undefined1 local_21c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_21b0 [23];
  char local_2038 [8200];
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"#line ",6);
  poVar4 = (ostream *)std::ostream::operator<<(os,startingLine);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," \"",2);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(filename->_M_dataplus)._M_p,filename->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"\n",2);
  std::ios::widen((char)myStream->_vptr_basic_istream[-3] + (char)myStream);
  plVar5 = (long *)std::istream::getline((char *)myStream,(long)local_2038,'\0');
  bVar14 = (*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) != 0;
  if (!bVar14) {
    local_2458 = &local_2488;
    local_2450 = &(defineSet->_M_t)._M_impl.super__Rb_tree_header._M_header;
    iVar11 = startingLine + 1;
    local_24d8 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)defineSet;
    local_2448 = filename;
    do {
      local_24d0 = (long *)&local_24c0;
      sVar6 = strlen(local_2038);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_24d0,local_2038,local_2038 + sVar6);
      std::locale::locale((locale *)local_23c8);
      plVar5 = local_24d0;
      _Var7 = std::
              __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<OpenMD::Utils::trimLeft(std::__cxx11::string&,std::locale_const&)::_lambda(auto:1)_1_>>
                        (local_24d0,(char *)((long)local_24d0 + local_24c8),(locale *)local_23c8);
      uVar12 = (long)plVar5 - (long)local_24d0;
      if ((char *)((long)local_24d0 + local_24c8) == _Var7._M_current) {
        *(char *)((long)local_24d0 + uVar12) = '\0';
        local_24c8 = uVar12;
      }
      else {
        std::__cxx11::string::_M_erase((ulong)&local_24d0,uVar12);
      }
      local_2498 = &local_2488;
      if (local_24d0 == (long *)&local_24c0) {
        uStack_2480 = uStack_24b8;
      }
      else {
        local_2498 = local_24d0;
      }
      local_2488 = CONCAT71(uStack_24bf,local_24c0);
      local_2490 = local_24c8;
      local_24c8 = 0;
      local_24c0 = 0;
      local_24d0 = (long *)&local_24c0;
      std::locale::~locale((locale *)local_23c8);
      if (local_24d0 != (long *)&local_24c0) {
        operator_delete(local_24d0,CONCAT71(uStack_24bf,local_24c0) + 1);
      }
      cVar2 = (char)os;
      if ((local_2490 == 0) || ((char)*local_2498 != '#')) {
        pbVar9 = (ifStates->c).super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur;
        if (pbVar9 == (ifStates->c).super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_first) {
          pbVar9 = (ifStates->c).super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_node[-1] + 0x200;
        }
        if (pbVar9[-1] == true) {
          sVar6 = strlen(local_2038);
          std::__ostream_insert<char,std::char_traits<char>>(os,local_2038,sVar6);
          std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
          std::ostream::put(cVar2);
          std::ostream::flush();
        }
      }
      else {
        std::__cxx11::string::substr((ulong)local_23c8,(ulong)&local_2498);
        local_21c0._0_8_ = local_21c0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_21c0," ;\t\n\r","");
        StringTokenizer::StringTokenizer(&local_2440,(string *)local_23c8,(string *)local_21c0);
        if ((undefined1 *)local_21c0._0_8_ != local_21c0 + 0x10) {
          operator_delete((void *)local_21c0._0_8_,local_21b0[0]._M_allocated_capacity + 1);
        }
        if ((undefined1 *)CONCAT71(local_23c8._1_7_,local_23c8[0]) != local_23c8 + 0x10) {
          operator_delete((undefined1 *)CONCAT71(local_23c8._1_7_,local_23c8[0]),
                          local_23c8._16_8_ + 1);
        }
        StringTokenizer::getAllTokens_abi_cxx11_(&local_24b0,&local_2440);
        if (local_24b0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_24b0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
LAB_0011e176:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_24b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2440.delim_._M_dataplus._M_p != &local_2440.delim_.field_2) {
            operator_delete(local_2440.delim_._M_dataplus._M_p,
                            local_2440.delim_.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2440.tokenString_._M_dataplus._M_p != &local_2440.tokenString_.field_2) {
            operator_delete(local_2440.tokenString_._M_dataplus._M_p,
                            local_2440.tokenString_.field_2._M_allocated_capacity + 1);
          }
          if (local_2498 == &local_2488) {
            return bVar14;
          }
          operator_delete(local_2498,local_2488 + 1);
          return bVar14;
        }
        iVar3 = std::__cxx11::string::compare
                          ((char *)local_24b0.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
        if (iVar3 == 0) {
          std::deque<bool,_std::allocator<bool>_>::pop_back(&ifStates->c);
          if ((ifStates->c).super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur ==
              (ifStates->c).super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Error in preprocessing: endif \n",0x1f);
            goto LAB_0011e176;
          }
LAB_0011e06f:
          std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
          std::ostream::put(cVar2);
          std::ostream::flush();
        }
        else {
          if ((long)local_24b0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_24b0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != 0x40) goto LAB_0011e176;
          iVar3 = std::__cxx11::string::compare
                            ((char *)local_24b0.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
          if (iVar3 != 0) {
            iVar3 = std::__cxx11::string::compare
                              ((char *)local_24b0.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
            if (iVar3 == 0) {
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        (local_24d8,
                         local_24b0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 1);
            }
            else {
              iVar3 = std::__cxx11::string::compare
                                ((char *)local_24b0.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
              if (iVar3 == 0) {
                pVar16 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::equal_range((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)local_24d8,
                                       local_24b0.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 1);
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::_M_erase_aux((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_24d8,(_Base_ptr)pVar16.first._M_node,
                               (_Base_ptr)pVar16.second._M_node);
              }
              else {
                iVar3 = std::__cxx11::string::compare
                                  ((char *)local_24b0.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start);
                if (iVar3 == 0) {
                  iVar8 = std::
                          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_24d8,
                                 local_24b0.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 1);
                  if (iVar8._M_node == local_2450) {
                    local_23c8[0] = (locale)0x0;
                    std::deque<bool,_std::allocator<bool>_>::emplace_back<bool>
                              (&ifStates->c,(bool *)local_23c8);
                  }
                  else {
                    local_23c8[0] = (locale)0x1;
                    std::deque<bool,_std::allocator<bool>_>::emplace_back<bool>
                              (&ifStates->c,(bool *)local_23c8);
                  }
                }
                else {
                  iVar3 = std::__cxx11::string::compare
                                    ((char *)local_24b0.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start);
                  if (iVar3 != 0) {
                    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)&std::cout,
                                        ((local_24b0.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                        _M_p,(local_24b0.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                             _M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar4," is not supported (yet).",0x18);
                    std::endl<char,std::char_traits<char>>(poVar4);
                    goto LAB_0011e176;
                  }
                  iVar8 = std::
                          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_24d8,
                                 local_24b0.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 1);
                  if (iVar8._M_node == local_2450) {
                    local_23c8[0] = (locale)0x1;
                    std::deque<bool,_std::allocator<bool>_>::emplace_back<bool>
                              (&ifStates->c,(bool *)local_23c8);
                  }
                  else {
                    local_23c8[0] = (locale)0x0;
                    std::deque<bool,_std::allocator<bool>_>::emplace_back<bool>
                              (&ifStates->c,(bool *)local_23c8);
                  }
                }
              }
            }
            goto LAB_0011e06f;
          }
          local_2478._M_dataplus._M_p = (pointer)&local_2478.field_2;
          pcVar1 = local_24b0.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2478,pcVar1,
                     pcVar1 + local_24b0.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
          std::__cxx11::string::substr((ulong)local_23c8,(ulong)&local_2478);
          std::__cxx11::string::operator=((string *)&local_2478,(string *)local_23c8);
          if ((undefined1 *)CONCAT71(local_23c8._1_7_,local_23c8[0]) != local_23c8 + 0x10) {
            operator_delete((undefined1 *)CONCAT71(local_23c8._1_7_,local_23c8[0]),
                            local_23c8._16_8_ + 1);
          }
          std::ifstream::ifstream(local_23c8,local_2478._M_dataplus._M_p,_S_in);
          cVar2 = std::__basic_file<char>::is_open();
          if (cVar2 == '\0') {
            std::__cxx11::stringstream::stringstream((stringstream *)local_21c0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_21c0 + 0x10),"Can not open ",0xd);
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)(local_21c0 + 0x10),local_2478._M_dataplus._M_p,
                                local_2478._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," for preprocessing\n",0x13);
            this_00 = (OpenMDException *)__cxa_allocate_exception(0x28);
            std::__cxx11::stringbuf::str();
            OpenMDException::OpenMDException(this_00,&local_23e8);
            __cxa_throw(this_00,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
          }
          bVar15 = doPreprocess(&local_24d9,(istream *)local_23c8,&local_2478,1,os,
                                (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_24d8,ifStates);
          lVar10 = 0x17;
          poVar4 = (ostream *)&std::cout;
          pcVar13 = "Error in preprocessing\n";
          if (bVar15) {
            std::__ostream_insert<char,std::char_traits<char>>(os,"#line ",6);
            poVar4 = (ostream *)std::ostream::operator<<(os,iVar11);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," \"",2);
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar4,(local_2448->_M_dataplus)._M_p,local_2448->_M_string_length);
            lVar10 = 2;
            pcVar13 = "\"\n";
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar13,lVar10);
          std::ifstream::~ifstream(local_23c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2478._M_dataplus._M_p != &local_2478.field_2) {
            operator_delete(local_2478._M_dataplus._M_p,local_2478.field_2._M_allocated_capacity + 1
                           );
          }
          if (!bVar15) goto LAB_0011e176;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_24b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2440.delim_._M_dataplus._M_p != &local_2440.delim_.field_2) {
          operator_delete(local_2440.delim_._M_dataplus._M_p,
                          local_2440.delim_.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2440.tokenString_._M_dataplus._M_p != &local_2440.tokenString_.field_2) {
          operator_delete(local_2440.tokenString_._M_dataplus._M_p,
                          local_2440.tokenString_.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_2498 != &local_2488) {
        operator_delete(local_2498,local_2488 + 1);
      }
      std::ios::widen((char)myStream->_vptr_basic_istream[-3] + (char)myStream);
      plVar5 = (long *)std::istream::getline((char *)myStream,(long)local_2038,'\0');
      iVar11 = iVar11 + 1;
      bVar15 = (*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) == 0;
      bVar14 = !bVar15;
    } while (bVar15);
  }
  return bVar14;
}

Assistant:

bool doPreprocess(std::istream& myStream, const std::string& filename, int startingLine, ostream& os, std::set<std::string>& defineSet, std::stack<bool>& ifStates) {
            //std::ifstream input(filename.c_str());
            //if (!input.is_open()) {
            //    std::stringstream ss;
            //    ss << "Can not open " << filename << " for preprocessing\n";
            //    
            //    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
            //            "Can not open (%s) for processing. \n"
            //            "\tPlease check md file name syntax.\n", filename.c_str());
            //    
            //    painCave.isFatal = 1;
            //    simError();
            //    
            //    throw OpenMDException(ss.str());                
            //}
            int lineNo = startingLine;
            os << "#line " << lineNo << " \"" << filename << "\"\n";
            const int bufferSize = 8192;
            char buffer[bufferSize];
            while(myStream.getline(buffer, bufferSize)) {
              ++lineNo;
              std::string line = Utils::trimLeftCopy(buffer);
              if (!line.empty() && line[0] == '#') {
                    StringTokenizer tokenizer(line.substr(1, line.length()));
                    std::vector<std::string> tokens = tokenizer.getAllTokens();
                    if (tokens.empty()) {
                        return false;
                    }
                    if (tokens[0] == "endif") {
                        ifStates.pop();
                        if (ifStates.empty()) {
                            std::cout << "Error in preprocessing: endif \n";
                            return false;
                        }
                        os << std::endl;                        
                    } else if (tokens.size() == 2) {
                        if (tokens[0] == "include") {
                            SimplePreprocessor subPreprocessor;
                            std::string includeFilename = tokens[1];
                            includeFilename = includeFilename.substr(1, includeFilename.length() -2);
                            std::ifstream includeStream(includeFilename.c_str());
                            if (!includeStream.is_open()) {
                                std::stringstream ss;
                                ss << "Can not open " << includeFilename << " for preprocessing\n";
                                throw OpenMDException(ss.str()); 
                            }
                            
                            bool ret = subPreprocessor.doPreprocess(includeStream, includeFilename, 1, os, defineSet, ifStates);
                            if (!ret) {
                                std::cout << "Error in preprocessing\n";
                                return false;
                            }
                            os << "#line " << lineNo << " \"" << filename << "\"\n";
                        } else if (tokens[0] == "define") {
                           defineSet.insert(tokens[1]);
                           os << std::endl;
                        } else if (tokens[0] == "undef") {
                           defineSet.erase(tokens[1]);
                           os << std::endl;
                        } else if (tokens[0] == "ifdef") {
                           if (defineSet.find(tokens[1]) != defineSet.end() ) {
                                ifStates.push(true);
                           } else {
                              ifStates.push(false);
                           }
                           os << std::endl;
                        } else if (tokens[0] == "ifndef") {
                           if (defineSet.find(tokens[1]) == defineSet.end() ) {
                                ifStates.push(true);
                           } else {
                              ifStates.push(false);
                           }
                           os << std::endl;
                        } else {
                            std::cout << tokens[0] << " is not supported (yet)." << std::endl;
                            return false;
                        }
                    }else {
                        return false;
                    }
                    
              }else if (ifStates.top()){
                os << buffer << std::endl;
              }
              
            }

            return true;
        }